

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::strArray<kj::Repeat<kj::StringPtr>>
          (String *__return_storage_ptr__,kj *this,Repeat<kj::StringPtr> *arr,char *delim)

{
  size_t __n;
  kj *this_00;
  size_t sVar1;
  StringPtr *s;
  ArrayPtr<const_char> *pAVar2;
  size_t size_00;
  ArrayPtr<kj::ArrayPtr<const_char>_> AVar3;
  ArrayPtr<const_char> AVar4;
  ArrayPtr<const_char> *local_130;
  size_t local_128;
  size_t i_1;
  char *pos;
  size_t local_100;
  size_t i;
  size_t size;
  undefined1 local_e0 [8];
  ArrayPtr<kj::ArrayPtr<const_char>_> pieces;
  Array<kj::ArrayPtr<const_char>_> pieces_heap;
  ArrayPtr<const_char> pieces_stack [8];
  bool pieces_isOnStack;
  size_t pieces_size;
  size_t delimLen;
  char *delim_local;
  Repeat<kj::StringPtr> *arr_local;
  String *result;
  
  __n = strlen((char *)arr);
  this_00 = (kj *)size<kj::Repeat<kj::StringPtr>&>((Repeat<kj::StringPtr> *)this);
  pieces_stack[7].size_._7_1_ = this_00 < (kj *)0x9;
  local_130 = (ArrayPtr<const_char> *)&pieces_heap.disposer;
  do {
    ArrayPtr<const_char>::ArrayPtr(local_130);
    local_130 = local_130 + 1;
  } while (local_130 != (ArrayPtr<const_char> *)&pieces_stack[7].size_);
  if ((pieces_stack[7].size_._7_1_ & 1) == 0) {
    heapArray<kj::ArrayPtr<char_const>>
              ((Array<kj::ArrayPtr<const_char>_> *)&pieces.size_,this_00,size_00);
  }
  else {
    Array<kj::ArrayPtr<const_char>_>::Array
              ((Array<kj::ArrayPtr<const_char>_> *)&pieces.size_,(void *)0x0);
  }
  if ((pieces_stack[7].size_._7_1_ & 1) == 0) {
    AVar3 = Array::operator_cast_to_ArrayPtr((Array *)&pieces.size_);
  }
  else {
    AVar3 = arrayPtr<kj::ArrayPtr<char_const>>
                      ((ArrayPtr<const_char> *)&pieces_heap.disposer,(size_t)this_00);
  }
  i = 0;
  local_100 = 0;
  while( true ) {
    pieces.ptr = (ArrayPtr<const_char> *)AVar3.size_;
    local_e0 = (undefined1  [8])AVar3.ptr;
    sVar1 = size<kj::Repeat<kj::StringPtr>&>((Repeat<kj::StringPtr> *)this);
    if (sVar1 <= local_100) break;
    if (local_100 != 0) {
      i = __n + i;
    }
    s = Repeat<kj::StringPtr>::operator[]((Repeat<kj::StringPtr> *)this,local_100);
    AVar4 = _::Stringifier::operator*((Stringifier *)&_::STR,s);
    pAVar2 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_e0,local_100);
    *pAVar2 = AVar4;
    pAVar2 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_e0,local_100);
    sVar1 = ArrayPtr<const_char>::size(pAVar2);
    AVar3.size_ = (size_t)pieces.ptr;
    AVar3.ptr = (ArrayPtr<const_char> *)local_e0;
    i = sVar1 + i;
    local_100 = local_100 + 1;
  }
  heapString(__return_storage_ptr__,i);
  i_1 = (size_t)String::begin(__return_storage_ptr__);
  for (local_128 = 0; sVar1 = size<kj::Repeat<kj::StringPtr>&>((Repeat<kj::StringPtr> *)this),
      local_128 < sVar1; local_128 = local_128 + 1) {
    if (local_128 != 0) {
      memcpy((void *)i_1,arr,__n);
      i_1 = __n + i_1;
    }
    pAVar2 = ArrayPtr<kj::ArrayPtr<const_char>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_char>_> *)local_e0,local_128);
    i_1 = (size_t)_::fill<kj::ArrayPtr<char_const>>((char *)i_1,pAVar2);
  }
  Array<kj::ArrayPtr<const_char>_>::~Array((Array<kj::ArrayPtr<const_char>_> *)&pieces.size_);
  return __return_storage_ptr__;
}

Assistant:

String strArray(T&& arr, const char* delim) {
  size_t delimLen = strlen(delim);
  KJ_STACK_ARRAY(decltype(_::STR * arr[0]), pieces, kj::size(arr), 8, 32);
  size_t size = 0;
  for (size_t i = 0; i < kj::size(arr); i++) {
    if (i > 0) size += delimLen;
    pieces[i] = _::STR * arr[i];
    size += pieces[i].size();
  }

  String result = heapString(size);
  char* pos = result.begin();
  for (size_t i = 0; i < kj::size(arr); i++) {
    if (i > 0) {
      memcpy(pos, delim, delimLen);
      pos += delimLen;
    }
    pos = _::fill(pos, pieces[i]);
  }
  return result;
}

template <typename... Params>
StringPtr strPreallocated(ArrayPtr<char> buffer, Params&&... params) {
  // Like str() but writes into a preallocated buffer. If the buffer is not long enough, the result
  // is truncated (but still NUL-terminated).
  //
  // This can be used like:
  //
  //     char buffer[256];
  //     StringPtr text = strPreallocated(buffer, params...);
  //
  // This is useful for optimization. It can also potentially be used safely in async signal
  // handlers. HOWEVER, to use in an async signal handler, all of the stringifiers for the inputs
  // must also be signal-safe. KJ guarantees signal safety when stringifying any built-in integer
  // type (but NOT floating-points), basic char/byte sequences (ArrayPtr<byte>, String, etc.), as
  // well as Array<T> as long as T can also be stringified safely. To safely stringify a delimited
  // array, you must use kj::delimited(arr, delim) rather than the deprecated
  // kj::strArray(arr, delim).

  char* end = _::fillLimited(buffer.begin(), buffer.end() - 1,
      toCharSequence(kj::fwd<Params>(params))...);
  *end = '\0';
  return StringPtr(buffer.begin(), end);
}

namespace _ {  // private

template <typename T>
inline _::Delimited<ArrayPtr<T>> Stringifier::operator*(ArrayPtr<T> arr) const {
  return _::Delimited<ArrayPtr<T>>(arr, ", ");
}

template <typename T>
inline _::Delimited<ArrayPtr<const T>> Stringifier::operator*(const Array<T>& arr) const {
  return _::Delimited<ArrayPtr<const T>>(arr, ", ");
}

}  // namespace _ (private)

#define KJ_STRINGIFY(...) operator*(::kj::_::Stringifier, __VA_ARGS__)
// Defines a stringifier for a custom type.  Example:
//
//    class Foo {...};
//    inline StringPtr KJ_STRINGIFY(const Foo& foo) { return foo.name(); }
//
// This allows Foo to be passed to str().
//
// The function should be declared either in the same namespace as the target type or in the global
// namespace.  It can return any type which is an iterable container of chars.

// =======================================================================================
// Inline implementation details.

inline StringPtr::StringPtr(const String& value): content(value.cStr(), value.size() + 1) {}

inline constexpr StringPtr::operator ArrayPtr<const char>() const {
  return ArrayPtr<const char>(content.begin(), content.size() - 1);
}

inline constexpr ArrayPtr<const char> StringPtr::asArray() const {
  return ArrayPtr<const char>(content.begin(), content.size() - 1);
}

inline bool StringPtr::operator==(const StringPtr& other) const {
  return content.size() == other.content.size() &&
      memcmp(content.begin(), other.content.begin(), content.size() - 1) == 0;
}

inline bool StringPtr::operator<(const StringPtr& other) const {
  bool shorter = content.size() < other.content.size();
  int cmp = memcmp(content.begin(), other.content.begin(),
                   shorter ? content.size() : other.content.size());
  return cmp < 0 || (cmp == 0 && shorter);
}

inline StringPtr StringPtr::slice(size_t start) const {
  return StringPtr(content.slice(start, content.size()));
}
inline ArrayPtr<const char> StringPtr::slice(size_t start, size_t end) const {
  return content.slice(start, end);
}

inline bool StringPtr::startsWith(const StringPtr& other) const {
  return other.content.size() <= content.size() &&
      memcmp(content.begin(), other.content.begin(), other.size()) == 0;
}
inline bool StringPtr::endsWith(const StringPtr& other) const {
  return other.content.size() <= content.size() &&
      memcmp(end() - other.size(), other.content.begin(), other.size()) == 0;
}

inline Maybe<size_t> StringPtr::findFirst(char c) const {
  const char* pos = reinterpret_cast<const char*>(memchr(content.begin(), c, size()));
  if (pos == nullptr) {
    return nullptr;
  } else {
    return pos - content.begin();
  }
}

inline Maybe<size_t> StringPtr::findLast(char c) const {
  for (size_t i = size(); i > 0; --i) {
    if (content[i-1] == c) {
      return i-1;
    }
  }
  return nullptr;
}

inline String::operator ArrayPtr<char>() {
  return content == nullptr ? ArrayPtr<char>(nullptr) : content.slice(0, content.size() - 1);
}
inline String::operator ArrayPtr<const char>() const {
  return content == nullptr ? ArrayPtr<const char>(nullptr) : content.slice(0, content.size() - 1);
}

inline ArrayPtr<char> String::asArray() {
  return content == nullptr ? ArrayPtr<char>(nullptr) : content.slice(0, content.size() - 1);
}
inline ArrayPtr<const char> String::asArray() const {
  return content == nullptr ? ArrayPtr<const char>(nullptr) : content.slice(0, content.size() - 1);
}

inline const char* String::cStr() const { return content == nullptr ? "" : content.begin(); }

inline size_t String::size() const { return content == nullptr ? 0 : content.size() - 1; }

inline char String::operator[](size_t index) const { return content[index]; }
inline char& String::operator[](size_t index) { return content[index]; }

inline char* String::begin() { return content == nullptr ? nullptr : content.begin(); }
inline char* String::end() { return content == nullptr ? nullptr : content.end() - 1; }
inline const char* String::begin() const { return content == nullptr ? nullptr : content.begin(); }
inline const char* String::end() const { return content == nullptr ? nullptr : content.end() - 1; }

inline String::String(char* value, size_t size, const ArrayDisposer& disposer)
    : content(value, size + 1, disposer) {
  KJ_IREQUIRE(value[size] == '\0', "String must be NUL-terminated.");
}

inline String::String(Array<char> buffer): content(kj::mv(buffer)) {
  KJ_IREQUIRE(content.size() > 0 && content.back() == '\0', "String must be NUL-terminated.");
}

inline String heapString(const char* value) {
  return heapString(value, strlen(value));
}
inline String heapString(StringPtr value) {
  return heapString(value.begin(), value.size());
}
inline String heapString(const String& value) {
  return heapString(value.begin(), value.size());
}
inline String heapString(ArrayPtr<const char> value) {
  return heapString(value.begin(), value.size());
}

namespace _ {  // private

template <typename T>
class Delimited {
public:
  Delimited(T array, kj::StringPtr delimiter)
      : array(kj::fwd<T>(array)), delimiter(delimiter) {}

  // TODO(someday): In theory we should support iteration as a character sequence, but the iterator
  //   will be pretty complicated.

  size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }

  char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }

  char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }

private:
  typedef decltype(toCharSequence(*instance<T>().begin())) StringifiedItem;
  T array;
  kj::StringPtr delimiter;
  Array<StringifiedItem> stringified;

  void ensureStringifiedInitialized() {
    if (array.size() > 0 && stringified.size() == 0) {
      stringified = KJ_MAP(e, array) { return toCharSequence(e); };
    }
  }
};

template <typename T, typename... Rest>
char* fill(char* __restrict__ target, Delimited<T> first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}
template <typename T, typename... Rest>
char* fillLimited(char* __restrict__ target, char* limit, Delimited<T> first, Rest&&... rest) {
  target = first.flattenTo(target, limit);
  return fillLimited(target, limit, kj::fwd<Rest>(rest)...);
}

template <typename T>
inline Delimited<T>&& KJ_STRINGIFY(Delimited<T>&& delimited) { return kj::mv(delimited); }
template <typename T>
inline const Delimited<T>& KJ_STRINGIFY(const Delimited<T>& delimited) { return delimited; }

}  // namespace _ (private)

template <typename T>
_::Delimited<T> delimited(T&& arr, kj::StringPtr delim) {
  return _::Delimited<T>(kj::fwd<T>(arr), delim);
}

}